

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GMAA_MAAstarCluster.cpp
# Opt level: O1

bool __thiscall
GMAA_MAAstarCluster::ConstructAndValuateNextPolicies
          (GMAA_MAAstarCluster *this,PartialPolicyPoolItemInterface_sharedPtr *ppi,
          PartialPolicyPoolInterface_sharedPtr *poolOfNextPolicies,bool *cleanUpPPI)

{
  int *piVar1;
  size_t *psVar2;
  string *psVar3;
  GeneralizedMAAStarPlanner *pGVar4;
  vector<int,_std::allocator<int>_> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  char *pcVar6;
  pointer pvVar7;
  iterator __position;
  QFunctionJAOHInterface *q;
  BGIP_IncrementalSolverCreatorInterface_T<JointPolicyPureVectorForClusteredBG> *pBVar8;
  element_type *peVar9;
  long lVar10;
  DecPOMDPDiscreteInterface *pDVar11;
  long *plVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [8];
  pointer pdVar15;
  shared_count sVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  ostream oVar19;
  char cVar20;
  int iVar21;
  undefined8 *puVar22;
  size_t sVar23;
  BayesianGameWithClusterInfo *this_01;
  BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG> *p;
  ostream *poVar24;
  ulong uVar25;
  ulong uVar26;
  ostream *poVar27;
  bool bVar28;
  double dVar29;
  double dVar30;
  undefined1 auVar31 [64];
  undefined1 auVar32 [16];
  shared_ptr<JointPolicyDiscretePure> bgpol_jpdp;
  BGwCI_sharedPtr newBG;
  PJPDP_sharedPtr pP;
  JPPVfCBG_sharedPtr jpolBGcopy;
  double val;
  PJPPV_sharedPtr pPcopy_1;
  stringstream ss;
  JointPolicyPureVectorForClusteredBG bestLBjpolBG;
  int local_4f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4e8;
  shared_count sStack_4e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4d8;
  shared_count sStack_4d0;
  BGwCI_constPtr local_4c8;
  undefined1 local_4b8 [8];
  shared_count local_4b0;
  shared_ptr<PartialJointPolicyDiscretePure> local_4a8;
  shared_ptr<JointPolicyPureVectorForClusteredBG> local_498;
  pointer local_480;
  pointer local_478;
  pointer local_470;
  undefined1 local_468 [8];
  shared_count sStack_460;
  shared_ptr<BayesianGameIdenticalPayoffSolver> local_458;
  Interface_ProblemToPolicyDiscretePure local_448;
  size_t sStack_440;
  map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  *local_430;
  pointer local_428;
  undefined1 local_420 [8];
  shared_count local_418;
  pointer local_410;
  undefined1 local_408 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f8 [24];
  JPPVfCBG_constPtr local_278;
  Interface_ProblemToPolicyDiscrete local_268;
  shared_count sStack_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  char acStack_248 [96];
  ios_base local_1e8 [112];
  char acStack_178 [160];
  JointPolicyPureVectorForClusteredBG local_d8;
  undefined1 extraout_var [56];
  
  local_448.super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete =
       (Interface_ProblemToPolicyDiscrete)(Interface_ProblemToPolicyDiscrete)poolOfNextPolicies;
  local_428 = (pointer)cleanUpPPI;
  (*ppi->px->_vptr_PartialPolicyPoolItemInterface[2])(&local_4a8);
  uVar25 = (((JointPolicyDiscrete *)
            &((BayesianGameForDecPOMDPStage *)&(local_4a8.px)->super_JointPolicyDiscretePure)->
             super_BayesianGameForDecPOMDPStageInterface)->super_JointPolicy)._m_depth;
  sVar23 = (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
           super_PlanningUnitDecPOMDPDiscrete.super_PlanningUnitMADPDiscrete.super_PlanningUnit.
           _m_horizon;
  sStack_4e0.pi_ = (sp_counted_base *)0x0;
  local_4d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
  sStack_4d0.pi_ = (sp_counted_base *)0x0;
  local_458.px = (element_type *)0x0;
  local_458.pn.pi_ = (sp_counted_base *)0x0;
  local_498.px = (element_type *)0x0;
  local_498.pn.pi_ = (sp_counted_base *)0x0;
  (*ppi->px->_vptr_PartialPolicyPoolItemInterface[5])(&local_268);
  local_478 = (pointer)(uVar25 & 0xffffffff);
  local_470 = (pointer)(sVar23 - 1);
  boost::detail::shared_count::~shared_count(&sStack_260);
  local_4f0 = (int)uVar25;
  if (local_268._vptr_Interface_ProblemToPolicyDiscrete == (_func_int **)0x0) {
    if (7 < (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
            super_GeneralizedMAAStarPlanner._m_verboseness) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"GMAA_MAAstarCluster: I have not expanded this ppi before..."
                 ,0x3b);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
      std::ostream::put(-0x50);
      std::ostream::flush();
    }
    psVar2 = &(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
              super_GeneralizedMAAStarPlanner._m_bgCounter;
    *psVar2 = *psVar2 + 1;
    if (local_4f0 == 0) {
      boost::make_shared<PartialJointPolicyPureVector,PartialJointPolicyDiscretePure&>
                ((boost *)local_408,local_4a8.px);
      boost::shared_ptr<PartialJointPolicyDiscretePure>::operator=
                (&local_4a8,(shared_ptr<PartialJointPolicyPureVector> *)local_408);
      this_01 = (BayesianGameWithClusterInfo *)operator_new(0x1c8);
      q = (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete)._m_qHeuristic;
      local_4c8.px = (element_type *)local_4a8.px;
      local_4c8.pn.pi_ = local_4a8.pn.pi_;
      if (local_4a8.pn.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (local_4a8.pn.pi_)->use_count_ = (local_4a8.pn.pi_)->use_count_ + 1;
        UNLOCK();
      }
      BayesianGameWithClusterInfo::BayesianGameWithClusterInfo
                (this_01,(PlanningUnitDecPOMDPDiscrete *)this,q,
                 (shared_ptr<const_PartialJointPolicyDiscretePure> *)&local_4c8,Lossless);
      boost::shared_ptr<BayesianGameWithClusterInfo>::shared_ptr<BayesianGameWithClusterInfo>
                ((shared_ptr<BayesianGameWithClusterInfo> *)&local_d8,this_01);
      sVar23 = local_d8.super_PartialJointPolicyPureVector.super_PartialJointPolicyDiscretePure.
               super_JointPolicyDiscretePure.super_JointPolicyDiscrete.super_JointPolicy._m_depth;
      local_4e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8.super_PartialJointPolicyPureVector.
                     super_PartialJointPolicyDiscretePure.super_JointPolicyDiscretePure.
                     super_JointPolicyDiscrete.super_JointPolicy._vptr_JointPolicy;
      sStack_260.pi_ = sStack_4e0.pi_;
      local_d8.super_PartialJointPolicyPureVector.super_PartialJointPolicyDiscretePure.
      super_JointPolicyDiscretePure.super_JointPolicyDiscrete.super_JointPolicy._vptr_JointPolicy =
           (_func_int **)0x0;
      local_d8.super_PartialJointPolicyPureVector.super_PartialJointPolicyDiscretePure.
      super_JointPolicyDiscretePure.super_JointPolicyDiscrete.super_JointPolicy._m_depth = 0;
      sStack_4e0.pi_ = (sp_counted_base *)sVar23;
      local_268._vptr_Interface_ProblemToPolicyDiscrete = (_func_int **)0x0;
      boost::detail::shared_count::~shared_count(&sStack_260);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &local_d8.super_PartialJointPolicyPureVector.super_PartialJointPolicyDiscretePure.
                  super_JointPolicyDiscretePure.super_JointPolicyDiscrete.super_JointPolicy._m_depth
                );
      boost::detail::shared_count::~shared_count(&local_4c8.pn);
      psVar3 = (string *)local_408;
    }
    else {
      boost::
      dynamic_pointer_cast<JointPolicyPureVectorForClusteredBG,PartialJointPolicyDiscretePure>
                ((boost *)local_408,&local_4a8);
      uVar18 = local_408._8_8_;
      uVar17 = local_408._0_8_;
      sStack_260.pi_ = local_498.pn.pi_;
      local_268._vptr_Interface_ProblemToPolicyDiscrete = (_func_int **)local_498.px;
      local_408._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_408._8_8_ = (_Base_ptr)0x0;
      local_498.px = (element_type *)uVar17;
      local_498.pn.pi_ = (sp_counted_base *)uVar18;
      boost::detail::shared_count::~shared_count(&sStack_260);
      boost::detail::shared_count::~shared_count
                ((shared_count *)&((string *)local_408)->_M_string_length);
      if (local_498.px == (element_type *)0x0) {
        puVar22 = (undefined8 *)__cxa_allocate_exception(0x28);
        *puVar22 = &PTR__E_0059bd80;
        puVar22[1] = puVar22 + 3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(puVar22 + 1),
                   "GMAA_MAAstarCluster::ConstructAndValuateNextPolicies - dynamic cast failed!","")
        ;
        goto LAB_003d25d9;
      }
      boost::make_shared<JointPolicyPureVectorForClusteredBG,JointPolicyPureVectorForClusteredBG&>
                ((boost *)&local_d8,local_498.px);
      boost::shared_ptr<JointPolicyPureVectorForClusteredBG>::operator=
                (&local_498,(shared_ptr<JointPolicyPureVectorForClusteredBG> *)&local_d8);
      local_4c8.px = *(element_type **)((long)local_498.px + 0x88);
      local_4c8.pn.pi_ =
           (sp_counted_base *)
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)local_498.px + 0x90))->_M_allocated_capacity;
      if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)((long)local_498.px + 0x90))->_M_allocated_capacity != 0) {
        LOCK();
        piVar1 = (int *)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)((long)local_498.px + 0x90))->_M_allocated_capacity + 8);
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      BayesianGameWithClusterInfo::ConstructExtendedBGWCI
                ((BayesianGameWithClusterInfo *)local_4b8,&local_4c8,
                 (JointPolicyDiscretePure *)local_498.px,
                 (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete)._m_qHeuristic);
      psVar3 = &(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
                super_GeneralizedMAAStarPlanner._m_bgBaseFilename;
      iVar21 = std::__cxx11::string::compare((char *)psVar3);
      if (iVar21 != 0) {
        std::__cxx11::stringstream::stringstream((stringstream *)&local_268);
        poVar24 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_258._M_local_buf,
                             (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
                             super_GeneralizedMAAStarPlanner._m_bgBaseFilename._M_dataplus._M_p,
                             (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
                             super_GeneralizedMAAStarPlanner._m_bgBaseFilename._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar24,"beforeCluster",0xd);
        lVar10 = *(long *)poVar24;
        *(undefined8 *)(poVar24 + *(long *)(lVar10 + -0x18) + 0x10) = 6;
        lVar10 = *(long *)(lVar10 + -0x18);
        poVar27 = poVar24 + lVar10;
        if (poVar24[lVar10 + 0xe1] == (ostream)0x0) {
          oVar19 = (ostream)std::ios::widen((char)poVar27);
          poVar27[0xe0] = oVar19;
          poVar27[0xe1] = (ostream)0x1;
        }
        poVar27[0xe0] = (ostream)0x30;
        poVar24 = std::ostream::_M_insert<unsigned_long>((ulong)poVar24);
        std::__ostream_insert<char,std::char_traits<char>>(poVar24,"_ts",3);
        lVar10 = *(long *)poVar24;
        *(undefined8 *)(poVar24 + *(long *)(lVar10 + -0x18) + 0x10) = 3;
        lVar10 = *(long *)(lVar10 + -0x18);
        poVar27 = poVar24 + lVar10;
        if (poVar24[lVar10 + 0xe1] == (ostream)0x0) {
          oVar19 = (ostream)std::ios::widen((char)poVar27);
          poVar27[0xe0] = oVar19;
          poVar27[0xe1] = (ostream)0x1;
        }
        poVar27[0xe0] = (ostream)0x30;
        std::ostream::_M_insert<unsigned_long>((ulong)poVar24);
        auVar14 = local_4b8;
        std::__cxx11::stringbuf::str();
        BayesianGameIdenticalPayoff::Save
                  ((BayesianGameIdenticalPayoff *)
                   &(((PartialJointPolicyPureVector *)auVar14)->super_PartialJointPolicyDiscretePure
                    ).super_JointPolicyDiscretePure.super_JointPolicyDiscrete._m_PTPD,
                   (string *)local_408);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_408._0_8_ != &((string *)local_408)->field_2) {
          operator_delete((void *)local_408._0_8_,local_3f8[0]._M_allocated_capacity + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&local_268);
        std::ios_base::~ios_base(local_1e8);
      }
      std::__cxx11::stringstream::stringstream((stringstream *)&local_268);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_258._M_local_buf,"GMAA_MAAstarCluster::BGCluster_ts",0x21);
      pcVar6 = local_258._M_local_buf + *(long *)(local_258._M_allocated_capacity - 0x18) + 0x10;
      pcVar6[0] = '\x03';
      pcVar6[1] = '\0';
      pcVar6[2] = '\0';
      pcVar6[3] = '\0';
      pcVar6[4] = '\0';
      pcVar6[5] = '\0';
      pcVar6[6] = '\0';
      pcVar6[7] = '\0';
      lVar10 = *(long *)(local_258._M_allocated_capacity - 0x18);
      if ((acStack_178 + 1)[lVar10] == '\0') {
        cVar20 = std::ios::widen((char)&local_258 + (char)lVar10);
        acStack_178[lVar10] = cVar20;
        (acStack_178 + 1)[lVar10] = '\x01';
      }
      acStack_178[lVar10] = '0';
      local_480 = (pointer)(uVar25 & 0xffffffff);
      std::ostream::_M_insert<unsigned_long>((ulong)&local_258);
      std::__cxx11::stringbuf::str();
      pGVar4 = &(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
                super_GeneralizedMAAStarPlanner;
      TimedAlgorithm::StartTimer(&pGVar4->super_TimedAlgorithm,(string *)local_408);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408._0_8_ != &((string *)local_408)->field_2) {
        operator_delete((void *)local_408._0_8_,local_3f8[0]._M_allocated_capacity + 1);
      }
      BayesianGameWithClusterInfo::Cluster((BayesianGameWithClusterInfo *)local_468);
      sVar16.pi_ = sStack_460.pi_;
      local_4e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_468;
      local_408._8_8_ = sStack_4e0.pi_;
      local_468 = (undefined1  [8])0x0;
      sStack_460.pi_ = (sp_counted_base *)0x0;
      sStack_4e0.pi_ = sVar16.pi_;
      local_408._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      boost::detail::shared_count::~shared_count
                ((shared_count *)&((string *)local_408)->_M_string_length);
      boost::detail::shared_count::~shared_count(&sStack_460);
      std::__cxx11::stringbuf::str();
      TimedAlgorithm::StopTimer(&pGVar4->super_TimedAlgorithm,(string *)local_408);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408._0_8_ != &((string *)local_408)->field_2) {
        operator_delete((void *)local_408._0_8_,local_3f8[0]._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&local_268);
      std::ios_base::~ios_base(local_1e8);
      uVar26 = (ulong)(uint)(&local_4e8->_M_allocated_capacity)[1];
      pvVar7 = (this->_m_clusteredBGsizes).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar25 = ((long)(this->_m_clusteredBGsizes).
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7 >> 3) *
               -0x5555555555555555;
      if (uVar25 < uVar26 || uVar25 - uVar26 == 0) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar26);
      }
      sVar23 = BayesianGameBase::GetNrJointTypes
                         ((BayesianGameBase *)(&local_4e8->_M_allocated_capacity + 4));
      this_00 = pvVar7 + uVar26;
      local_268._vptr_Interface_ProblemToPolicyDiscrete._0_4_ = (int)sVar23;
      __position._M_current =
           (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      if (__position._M_current ==
          (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (this_00,__position,(int *)&local_268);
      }
      else {
        *__position._M_current = (int)sVar23;
        (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = __position._M_current + 1;
      }
      iVar21 = std::__cxx11::string::compare((char *)&this->_m_clusterStatsFilename);
      if (iVar21 != 0) {
        SaveClusterStats(this,&this->_m_clusterStatsFilename);
      }
      iVar21 = std::__cxx11::string::compare((char *)psVar3);
      if (iVar21 != 0) {
        std::__cxx11::stringstream::stringstream((stringstream *)&local_268);
        poVar24 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_258._M_local_buf,
                             (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
                             super_GeneralizedMAAStarPlanner._m_bgBaseFilename._M_dataplus._M_p,
                             (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
                             super_GeneralizedMAAStarPlanner._m_bgBaseFilename._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar24,"afterCluster",0xc);
        lVar10 = *(long *)poVar24;
        *(undefined8 *)(poVar24 + *(long *)(lVar10 + -0x18) + 0x10) = 6;
        lVar10 = *(long *)(lVar10 + -0x18);
        poVar27 = poVar24 + lVar10;
        if (poVar24[lVar10 + 0xe1] == (ostream)0x0) {
          oVar19 = (ostream)std::ios::widen((char)poVar27);
          poVar27[0xe0] = oVar19;
          poVar27[0xe1] = (ostream)0x1;
        }
        poVar27[0xe0] = (ostream)0x30;
        poVar24 = std::ostream::_M_insert<unsigned_long>((ulong)poVar24);
        std::__ostream_insert<char,std::char_traits<char>>(poVar24,"_ts",3);
        lVar10 = *(long *)poVar24;
        *(undefined8 *)(poVar24 + *(long *)(lVar10 + -0x18) + 0x10) = 3;
        lVar10 = *(long *)(lVar10 + -0x18);
        poVar27 = poVar24 + lVar10;
        if (poVar24[lVar10 + 0xe1] == (ostream)0x0) {
          oVar19 = (ostream)std::ios::widen((char)poVar27);
          poVar27[0xe0] = oVar19;
          poVar27[0xe1] = (ostream)0x1;
        }
        poVar27[0xe0] = (ostream)0x30;
        std::ostream::_M_insert<unsigned_long>((ulong)poVar24);
        std::__cxx11::stringbuf::str();
        BayesianGameIdenticalPayoff::Save
                  ((BayesianGameIdenticalPayoff *)(&local_4e8->_M_allocated_capacity + 4),
                   (string *)local_408);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_408._0_8_ != &((string *)local_408)->field_2) {
          operator_delete((void *)local_408._0_8_,local_3f8[0]._M_allocated_capacity + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&local_268);
        std::ios_base::~ios_base(local_1e8);
      }
      boost::detail::shared_count::~shared_count(&local_4b0);
      boost::detail::shared_count::~shared_count(&local_4c8.pn);
      psVar3 = (string *)
               &local_d8.super_PartialJointPolicyPureVector.super_PartialJointPolicyDiscretePure.
                super_JointPolicyDiscretePure.super_JointPolicyDiscrete.super_JointPolicy;
    }
    boost::detail::shared_count::~shared_count((shared_count *)((long)psVar3 + 8));
    pBVar8 = this->_m_newBGIP_Solver;
    local_d8.super_PartialJointPolicyPureVector.super_PartialJointPolicyDiscretePure.
    super_JointPolicyDiscretePure.super_JointPolicyDiscrete.super_JointPolicy._vptr_JointPolicy =
         (_func_int **)(&local_4e8->_M_allocated_capacity + 4);
    if (local_4e8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      local_d8.super_PartialJointPolicyPureVector.super_PartialJointPolicyDiscretePure.
      super_JointPolicyDiscretePure.super_JointPolicyDiscrete.super_JointPolicy._vptr_JointPolicy =
           (_func_int **)0x0;
    }
    local_d8.super_PartialJointPolicyPureVector.super_PartialJointPolicyDiscretePure.
    super_JointPolicyDiscretePure.super_JointPolicyDiscrete.super_JointPolicy._m_depth =
         (size_t)sStack_4e0.pi_;
    if ((_Base_ptr)sStack_4e0.pi_ != (_Base_ptr)0x0) {
      LOCK();
      (sStack_4e0.pi_)->use_count_ = (sStack_4e0.pi_)->use_count_ + 1;
      UNLOCK();
    }
    p = (BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG> *)
        (**(code **)(*(long *)pBVar8 + 0x10))(pBVar8,&local_d8);
    boost::shared_ptr<BayesianGameIdenticalPayoffSolver>::
    shared_ptr<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>>
              ((shared_ptr<BayesianGameIdenticalPayoffSolver> *)local_408,p);
    uVar18 = local_408._8_8_;
    uVar17 = local_408._0_8_;
    sStack_260.pi_ = local_458.pn.pi_;
    local_268._vptr_Interface_ProblemToPolicyDiscrete = (_func_int **)local_458.px;
    local_408._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_408._8_8_ = (_Base_ptr)0x0;
    local_458.px = (element_type *)uVar17;
    local_458.pn.pi_ = (sp_counted_base *)uVar18;
    boost::detail::shared_count::~shared_count(&sStack_260);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&((string *)local_408)->_M_string_length);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &local_d8.super_PartialJointPolicyPureVector.super_PartialJointPolicyDiscretePure.
                super_JointPolicyDiscretePure.super_JointPolicyDiscrete.super_JointPolicy._m_depth);
    boost::
    dynamic_pointer_cast<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>,BayesianGameIdenticalPayoffSolver>
              ((boost *)local_408,&local_458);
    uVar18 = local_408._8_8_;
    uVar17 = local_408._0_8_;
    sStack_260.pi_ = sStack_4d0.pi_;
    local_268._vptr_Interface_ProblemToPolicyDiscrete = (_func_int **)local_4d8;
    local_408._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_408._8_8_ = (_Base_ptr)0x0;
    local_4d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)uVar17;
    sStack_4d0.pi_ = (sp_counted_base *)uVar18;
    boost::detail::shared_count::~shared_count(&sStack_260);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&((string *)local_408)->_M_string_length);
    if (local_4d8 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      if (local_478 == local_470) {
        BGIPSolution::SetNrDesiredSolutions((BGIPSolution *)((long)local_4d8 + 0x18),1);
      }
      else if (local_4d8[3]._M_allocated_capacity != 0x7fffffff) {
        puVar22 = (undefined8 *)__cxa_allocate_exception(0x28);
        *puVar22 = &PTR__E_0059bd80;
        puVar22[1] = puVar22 + 3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(puVar22 + 1),
                   "GMAA_MAAstar requires a BGIP solver to return all solutions (when requested)",""
                  );
        goto LAB_003d25d9;
      }
      peVar9 = ppi->px;
      local_268._vptr_Interface_ProblemToPolicyDiscrete = (_func_int **)local_4d8;
      sStack_260.pi_ = sStack_4d0.pi_;
      if ((_Base_ptr)sStack_4d0.pi_ != (_Base_ptr)0x0) {
        LOCK();
        (sStack_4d0.pi_)->use_count_ = (sStack_4d0.pi_)->use_count_ + 1;
        UNLOCK();
      }
      (*peVar9->_vptr_PartialPolicyPoolItemInterface[7])(peVar9,&local_268);
      boost::detail::shared_count::~shared_count(&sStack_260);
LAB_003d1d9c:
      if (1 < (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
              super_GeneralizedMAAStarPlanner._m_verboseness) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"About to solve the following BG:",0x20);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
        std::ostream::put(-0x50);
        std::ostream::flush();
        (**(code **)(local_4e8->_M_allocated_capacity + 0x30))(&local_268);
        poVar24 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             (char *)local_268._vptr_Interface_ProblemToPolicyDiscrete,
                             (long)sStack_260.pi_);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar24 + -0x18) + (char)poVar24);
        std::ostream::put((char)poVar24);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._vptr_Interface_ProblemToPolicyDiscrete != &local_258) {
          operator_delete(local_268._vptr_Interface_ProblemToPolicyDiscrete,
                          local_258._M_allocated_capacity + 1);
        }
      }
      local_480 = (((BayesianGameForDecPOMDPStage *)&(local_4a8.px)->super_JointPolicyDiscretePure)
                  ->super_BayesianGameIdenticalPayoff).super_BayesianGameIdenticalPayoffInterface.
                  super_BayesianGameBase._m_jTypeProbs.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      std::__cxx11::stringstream::stringstream((stringstream *)&local_268);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_258._M_local_buf,"GMAA_MAAstarCluster::NextExact_ts",0x21);
      pcVar6 = local_258._M_local_buf + *(long *)(local_258._M_allocated_capacity - 0x18) + 0x10;
      pcVar6[0] = '\x03';
      pcVar6[1] = '\0';
      pcVar6[2] = '\0';
      pcVar6[3] = '\0';
      pcVar6[4] = '\0';
      pcVar6[5] = '\0';
      pcVar6[6] = '\0';
      pcVar6[7] = '\0';
      lVar10 = *(long *)(local_258._M_allocated_capacity - 0x18);
      if ((acStack_178 + 1)[lVar10] == '\0') {
        cVar20 = std::ios::widen((char)&local_258 + (char)lVar10);
        acStack_178[lVar10] = cVar20;
        (acStack_178 + 1)[lVar10] = '\x01';
      }
      acStack_178[lVar10] = '0';
      std::ostream::_M_insert<unsigned_long>((ulong)&local_258);
      std::__cxx11::stringbuf::str();
      pGVar4 = &(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
                super_GeneralizedMAAStarPlanner;
      TimedAlgorithm::StartTimer(&pGVar4->super_TimedAlgorithm,(string *)local_408);
      paVar5 = &((string *)local_408)->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408._0_8_ != paVar5) {
        operator_delete((void *)local_408._0_8_,local_3f8[0]._M_allocated_capacity + 1);
      }
      GeneralizedMAAStarPlannerForDecPOMDPDiscrete::SetCBGbounds
                (&this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete,ppi,&local_458);
      local_408._0_8_ = &local_4e8->_M_allocated_capacity + 4;
      if (local_4e8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        local_408._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
      }
      local_408._8_8_ = sStack_4e0.pi_;
      if ((_Base_ptr)sStack_4e0.pi_ != (_Base_ptr)0x0) {
        LOCK();
        (sStack_4e0.pi_)->use_count_ = (sStack_4e0.pi_)->use_count_ + 1;
        UNLOCK();
      }
      local_278.px = (element_type *)0x0;
      local_278.pn.pi_ = (sp_counted_base *)0x0;
      JointPolicyPureVectorForClusteredBG::JointPolicyPureVectorForClusteredBG
                (&local_d8,(shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)local_408,
                 TYPE_INDEX,&local_278,0.0);
      boost::detail::shared_count::~shared_count(&local_278.pn);
      boost::detail::shared_count::~shared_count
                ((shared_count *)&((string *)local_408)->_M_string_length);
      local_4c8.px = (element_type *)0x0;
      local_4c8.pn.pi_ = (sp_counted_base *)0x0;
      *(long *)(local_4d8->_M_local_buf + 0x108) = *(long *)(local_4d8->_M_local_buf + 0x108) + 1;
      cVar20 = (**(code **)(local_4d8->_M_allocated_capacity + 0x50))
                         (local_4d8,&local_4c8,&local_410);
      if (cVar20 == '\0') {
        if (0 < (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
                super_GeneralizedMAAStarPlanner._m_verboseness) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "GMAA_MAAstar no valid solution returned by the Incremental BGIP Solver",0x46);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
          std::ostream::put(-0x50);
          std::ostream::flush();
        }
        (*ppi->px->_vptr_PartialPolicyPoolItemInterface[4])(0xffefffffffffffff);
      }
      else {
        boost::dynamic_pointer_cast<JointPolicyPureVectorForClusteredBG,JointPolicyDiscretePure>
                  ((boost *)local_4b8,(shared_ptr<JointPolicyDiscretePure> *)&local_4c8);
        if (local_4b8 == (undefined1  [8])0x0) {
          puVar22 = (undefined8 *)__cxa_allocate_exception(0x28);
          *puVar22 = &PTR__E_0059bd80;
          puVar22[1] = puVar22 + 3;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)(puVar22 + 1),
                     "GMAA_MAAstarCluster: did not get a valid policy from the incremental BGIP solver"
                     ,"");
          __cxa_throw(puVar22,&E::typeinfo,E::~E);
        }
        local_408._0_8_ = local_4b8;
        local_408._8_8_ = local_4b0.pi_;
        if ((_Base_ptr)local_4b0.pi_ != (_Base_ptr)0x0) {
          LOCK();
          (local_4b0.pi_)->use_count_ = (local_4b0.pi_)->use_count_ + 1;
          UNLOCK();
        }
        local_430 = (map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                     *)(**(code **)(local_4e8->_M_allocated_capacity + 0x28))
                                 (local_4e8,(string *)local_408,0);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)&((string *)local_408)->_M_string_length);
        if (local_4b8 == (undefined1  [8])0x0) {
          local_408._0_8_ = (JointPolicyPureVectorForClusteredBG *)0x0;
          local_408._8_8_ = (_Base_ptr)0x0;
        }
        else {
          local_408._0_8_ = local_4b8;
          local_408._8_8_ = local_4b0.pi_;
          if ((_Base_ptr)local_4b0.pi_ != (_Base_ptr)0x0) {
            LOCK();
            (local_4b0.pi_)->use_count_ = (local_4b0.pi_)->use_count_ + 1;
            UNLOCK();
          }
        }
        boost::make_shared<JointPolicyPureVectorForClusteredBG,JointPolicyPureVectorForClusteredBG&>
                  ((boost *)local_468,(JointPolicyPureVectorForClusteredBG *)local_408._0_8_);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)&((string *)local_408)->_M_string_length);
        (**(code **)(*(size_type *)local_468 + 0x10))(local_468,local_4f0 + 1);
        pDVar11 = (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
                  super_PlanningUnitDecPOMDPDiscrete._m_DecPOMDP;
        auVar32 = (**(code **)(*(long *)((long)&pDVar11->field_0x0 +
                                        *(long *)(*(long *)pDVar11 + -0xb0)) + 0x70))
                            ((long)&pDVar11->field_0x0 + *(long *)(*(long *)pDVar11 + -0xb0));
        auVar31._0_8_ = auVar32._8_8_;
        auVar31._8_56_ = extraout_var;
        bVar28 = local_478 == local_470;
        auVar13 = vcvtusi2sd_avx512f(auVar31._0_16_,local_4f0);
        dVar29 = pow(auVar32._0_8_,auVar13._0_8_);
        *(double *)((long)local_468 + 0x38) = (double)local_480 + (double)local_430;
        plVar12 = *(long **)local_448.super_Interface_ProblemToPolicyDiscrete.
                            _vptr_Interface_ProblemToPolicyDiscrete;
        local_408._0_8_ = local_468;
        local_408._8_8_ = sStack_460.pi_;
        if ((_Base_ptr)sStack_460.pi_ != (_Base_ptr)0x0) {
          LOCK();
          (sStack_460.pi_)->use_count_ = (sStack_460.pi_)->use_count_ + 1;
          UNLOCK();
        }
        sStack_440 = 0;
        local_448.super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete =
             (Interface_ProblemToPolicyDiscrete)
             (_func_int **)
             ((ulong)bVar28 * (long)((double)local_480 + (double)local_430) +
             (ulong)!bVar28 * (long)((double)local_480 + dVar29 * (double)local_410));
        (*(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
          super_PlanningUnitDecPOMDPDiscrete.super_PlanningUnitMADPDiscrete.super_PlanningUnit.
          _vptr_PlanningUnit[0x16])(local_420,this,(string *)local_408);
        dVar29 = (double)(**(code **)(*plVar12 + 0x40))(plVar12,local_420);
        boost::detail::shared_count::~shared_count(&local_418);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)&((string *)local_408)->_M_string_length);
        if (local_4f0 != 0) {
          (*ppi->px->_vptr_PartialPolicyPoolItemInterface[3])();
          (*ppi->px->_vptr_PartialPolicyPoolItemInterface[4])
                    (local_448.super_Interface_ProblemToPolicyDiscrete.
                     _vptr_Interface_ProblemToPolicyDiscrete);
          pDVar11 = (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
                    super_PlanningUnitDecPOMDPDiscrete._m_DecPOMDP;
          dVar30 = (double)(**(code **)(*(long *)((long)&pDVar11->field_0x0 +
                                                 *(long *)(*(long *)pDVar11 + -0xb0)) + 0x70))
                                     ((long)&pDVar11->field_0x0 +
                                      *(long *)(*(long *)pDVar11 + -0xb0));
          if ((dVar30 == 1.0) && (!NAN(dVar30))) {
            (*ppi->px->_vptr_PartialPolicyPoolItemInterface[3])();
            if (dVar29 < dVar30) {
              (*ppi->px->_vptr_PartialPolicyPoolItemInterface[3])();
              bVar28 = Globals::EqualReward(dVar29,dVar30);
              if (!bVar28) {
                std::__cxx11::stringstream::stringstream((stringstream *)local_408);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&((string *)local_408)->field_2,
                           "GMAA_MAAstarCluster value of parent can only go down when being updated: old value="
                           ,0x53);
                dVar30 = dVar29;
                poVar24 = std::ostream::_M_insert<double>(dVar29);
                std::__ostream_insert<char,std::char_traits<char>>(poVar24," new value=",0xb);
                (*ppi->px->_vptr_PartialPolicyPoolItemInterface[3])();
                poVar24 = std::ostream::_M_insert<double>(dVar30);
                std::__ostream_insert<char,std::char_traits<char>>(poVar24," old-new=",9);
                (*ppi->px->_vptr_PartialPolicyPoolItemInterface[3])();
                std::ostream::_M_insert<double>(dVar29 - dVar30);
                puVar22 = (undefined8 *)__cxa_allocate_exception(0x28);
                *puVar22 = &PTR__E_0059bd80;
                std::__cxx11::stringbuf::str();
                __cxa_throw(puVar22,&E::typeinfo,E::~E);
              }
            }
          }
        }
        boost::detail::shared_count::~shared_count(&sStack_460);
        boost::detail::shared_count::~shared_count(&local_4b0);
      }
      bVar28 = BGIP_IncrementalSolverInterface::AllSolutionsHaveBeenReturned
                         ((BGIP_IncrementalSolverInterface *)local_4d8);
      if (bVar28) {
        bVar28 = true;
        if (3 < (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
                super_GeneralizedMAAStarPlanner._m_verboseness) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,">>>AllSolutionsHaveBeenReturned, removing ",0x2a);
          (*(((JointPolicyDiscrete *)
             &((BayesianGameForDecPOMDPStage *)&(local_4a8.px)->super_JointPolicyDiscretePure)->
              super_BayesianGameForDecPOMDPStageInterface)->super_JointPolicy)._vptr_JointPolicy[6])
                    ((string *)local_408);
          poVar24 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,(char *)local_408._0_8_,local_408._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar24,"<<<",3);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar24 + -0x18) + (char)poVar24);
          std::ostream::put((char)poVar24);
          std::ostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_408._0_8_ != paVar5) {
            operator_delete((void *)local_408._0_8_,local_3f8[0]._M_allocated_capacity + 1);
          }
        }
      }
      else {
        bVar28 = false;
      }
      *(bool *)local_428 = bVar28;
      std::__cxx11::stringbuf::str();
      TimedAlgorithm::StopTimer(&pGVar4->super_TimedAlgorithm,(string *)local_408);
      pdVar15 = local_470;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408._0_8_ != paVar5) {
        operator_delete((void *)local_408._0_8_,local_3f8[0]._M_allocated_capacity + 1);
      }
      bVar28 = local_478 == pdVar15;
      boost::detail::shared_count::~shared_count(&local_4c8.pn);
      JointPolicyPureVectorForClusteredBG::~JointPolicyPureVectorForClusteredBG(&local_d8);
      std::__cxx11::stringstream::~stringstream((stringstream *)&local_268);
      std::ios_base::~ios_base(local_1e8);
      boost::detail::shared_count::~shared_count(&local_498.pn);
      boost::detail::shared_count::~shared_count(&local_458.pn);
      boost::detail::shared_count::~shared_count(&sStack_4d0);
      boost::detail::shared_count::~shared_count(&sStack_4e0);
      boost::detail::shared_count::~shared_count(&local_4a8.pn);
      return bVar28;
    }
    puVar22 = (undefined8 *)__cxa_allocate_exception(0x28);
    *puVar22 = &PTR__E_0059bd80;
    puVar22[1] = puVar22 + 3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(puVar22 + 1),
               "GMAA_MAAstarCluster requires BGIP_IncrementalSolverInterface_T solvers","");
  }
  else {
    if (7 < (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
            super_GeneralizedMAAStarPlanner._m_verboseness) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "GMAA_MAAstarCluster: ppi was expanded before, getting the previous BGIPSolver...",
                 0x50);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
      std::ostream::put(-0x50);
      std::ostream::flush();
    }
    (*ppi->px->_vptr_PartialPolicyPoolItemInterface[5])((string *)local_408);
    uVar18 = local_408._8_8_;
    uVar17 = local_408._0_8_;
    sStack_260.pi_ = local_458.pn.pi_;
    local_268._vptr_Interface_ProblemToPolicyDiscrete = (_func_int **)local_458.px;
    local_408._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_408._8_8_ = (_Base_ptr)0x0;
    local_458.px = (element_type *)uVar17;
    local_458.pn.pi_ = (sp_counted_base *)uVar18;
    boost::detail::shared_count::~shared_count(&sStack_260);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&((string *)local_408)->_M_string_length);
    boost::
    dynamic_pointer_cast<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>,BayesianGameIdenticalPayoffSolver>
              ((boost *)local_408,&local_458);
    uVar18 = local_408._8_8_;
    uVar17 = local_408._0_8_;
    sStack_260.pi_ = sStack_4d0.pi_;
    local_268._vptr_Interface_ProblemToPolicyDiscrete = (_func_int **)local_4d8;
    local_408._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_408._8_8_ = (_Base_ptr)0x0;
    local_4d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)uVar17;
    sStack_4d0.pi_ = (sp_counted_base *)uVar18;
    boost::detail::shared_count::~shared_count(&sStack_260);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&((string *)local_408)->_M_string_length);
    if (local_4d8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      puVar22 = (undefined8 *)__cxa_allocate_exception(0x28);
      *puVar22 = &PTR__E_0059bd80;
      puVar22[1] = puVar22 + 3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(puVar22 + 1),
                 "GMAA_MAAstarCluster requires BGIP_IncrementalSolverInterface_T solvers","");
    }
    else {
      local_d8.super_PartialJointPolicyPureVector.super_PartialJointPolicyDiscretePure.
      super_JointPolicyDiscretePure.super_JointPolicyDiscrete.super_JointPolicy._vptr_JointPolicy =
           *(_func_int ***)((long)local_4d8 + 8);
      local_d8.super_PartialJointPolicyPureVector.super_PartialJointPolicyDiscretePure.
      super_JointPolicyDiscretePure.super_JointPolicyDiscrete.super_JointPolicy._m_depth =
           local_4d8[1]._M_allocated_capacity;
      if (local_4d8[1]._M_allocated_capacity != 0) {
        LOCK();
        lVar10 = local_4d8[1]._M_allocated_capacity + 8;
        *(int *)lVar10 = *(int *)lVar10 + 1;
        UNLOCK();
      }
      boost::
      dynamic_pointer_cast<BayesianGameWithClusterInfo_const,BayesianGameIdenticalPayoffInterface_const>
                ((boost *)local_408,
                 (shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)&local_d8);
      uVar17 = local_408._8_8_;
      local_4e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_408._0_8_;
      sStack_260.pi_ = sStack_4e0.pi_;
      local_408._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_408._8_8_ = (_Base_ptr)0x0;
      sStack_4e0.pi_ = (sp_counted_base *)uVar17;
      local_268._vptr_Interface_ProblemToPolicyDiscrete = (_func_int **)0x0;
      boost::detail::shared_count::~shared_count(&sStack_260);
      boost::detail::shared_count::~shared_count
                ((shared_count *)&((string *)local_408)->_M_string_length);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &local_d8.super_PartialJointPolicyPureVector.super_PartialJointPolicyDiscretePure.
                  super_JointPolicyDiscretePure.super_JointPolicyDiscrete.super_JointPolicy._m_depth
                );
      if (local_4e8 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) goto LAB_003d1d9c;
      puVar22 = (undefined8 *)__cxa_allocate_exception(0x28);
      *puVar22 = &PTR__E_0059bd80;
      puVar22[1] = puVar22 + 3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(puVar22 + 1),"GMAA_MAAstarCluster BG is not of the correct type","");
    }
  }
LAB_003d25d9:
  __cxa_throw(puVar22,&E::typeinfo,E::~E);
}

Assistant:

bool GMAA_MAAstarCluster::ConstructAndValuateNextPolicies(
        const PartialPolicyPoolItemInterface_sharedPtr &ppi,
        const PartialPolicyPoolInterface_sharedPtr &poolOfNextPolicies,
        bool &cleanUpPPI)
{
    PJPDP_sharedPtr pP = ppi->GetJPol();
    Index ts = pP->GetDepth();
    bool is_last_ts = (ts ==  GetHorizon() - 1);

    BGwCI_constPtr bg_ts;
    boost::shared_ptr<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG> > bgips;
    //boost::shared_ptr<BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVectorForClusteredBG> > bgipsNonIncremental;
    boost::shared_ptr<BayesianGameIdenticalPayoffSolver> bgipsNonIncremental;

    JPPVfCBG_sharedPtr pJPolBG;

    if(ppi->GetBGIPSolverPointer()==0)
    {
        if(_m_verboseness >= 8) 
            cout << "GMAA_MAAstarCluster: I have not expanded this ppi before..." << endl;

        _m_bgCounter++;
        if(ts == 0)
        {
            //first stage, build BG from scratch.
            //also here we need to store the past policy
            PJPPV_sharedPtr pPcopy = boost::make_shared<PartialJointPolicyPureVector>(*pP);
            pP = pPcopy;

// Apparently make_shared works differently on Ubuntu 11.10, so call shared_ptr directly
//            bg_ts = boost::make_shared<BayesianGameWithClusterInfo>(this, _m_qHeuristic, pP);
            bg_ts = boost::shared_ptr<BayesianGameWithClusterInfo>(new BayesianGameWithClusterInfo(this, _m_qHeuristic, pP));
        }
        else
        {
            pJPolBG = 
                boost::dynamic_pointer_cast<JointPolicyPureVectorForClusteredBG>(pP);
            if(pJPolBG == 0)
                throw E("GMAA_MAAstarCluster::ConstructAndValuateNextPolicies - dynamic cast failed!"); 
            
            //when this function returns, ppi and the policy pointed to will be 
            //deleted by GeneralizedMAAStarPlannerForDecPOMDPDiscrete.
            //However, we need to preserve the past (bg) policy to reconstruct the
            //final policy!
            //As a solution, we make an actual copy here.
            JPPVfCBG_sharedPtr pPcopy = boost::make_shared<JointPolicyPureVectorForClusteredBG>(*pJPolBG);
            pJPolBG = pPcopy;

            BGwCI_constPtr pBG = pJPolBG->GetBG();
            BGwCI_sharedPtr newBG = 
                BayesianGameWithClusterInfo::ConstructExtendedBGWCI(pBG,*pJPolBG, _m_qHeuristic);
            
            if(_m_bgBaseFilename!="")
            {
                stringstream ssBefore;
                ssBefore << _m_bgBaseFilename << "beforeCluster"
                         << setw(6) << setfill('0')
                         << _m_bgCounter << "_ts"
                         << setw(3) << setfill('0') << ts;
                BayesianGameIdenticalPayoff::Save(*newBG,ssBefore.str());
            }

            {
                stringstream ss;
                ss << "GMAA_MAAstarCluster::BGCluster_ts" 
                   << setw(3) << setfill('0') << ts;
                StartTimer(ss.str());
                // do the clustering
                bg_ts = newBG->Cluster();
                StopTimer(ss.str());
            }

            _m_clusteredBGsizes.at(
                bg_ts->GetStage()).push_back(bg_ts->GetNrJointTypes());
            if(_m_clusterStatsFilename!="")
                SaveClusterStats(_m_clusterStatsFilename);
        
            if(_m_bgBaseFilename!="")
            {
                stringstream ssAfter;
                ssAfter << _m_bgBaseFilename << "afterCluster"
                         << setw(6) << setfill('0')
                         << _m_bgCounter << "_ts"
                         << setw(3) << setfill('0') << ts;
                BayesianGameIdenticalPayoff::Save(*bg_ts,ssAfter.str());
            }
        }

        // keep track of every bg_ts we instantiate, so we can clean
        // them up after solving
//        _m_pointersToAllBGTS.push_back(bg_ts);

        // create the BGIPSolver
        // _m_newBGIP_Solver is pointer to a BGSolverCreator, here this functor is called:
        bgipsNonIncremental =
            boost::shared_ptr<BayesianGameIdenticalPayoffSolver >(
                    _m_newBGIP_Solver->operator()(bg_ts) );

        //check if it can be converted to an incremental solver:
        bgips = 
            boost::dynamic_pointer_cast<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG> > (bgipsNonIncremental);

        if(bgips==0)
            throw(E("GMAA_MAAstarCluster requires BGIP_IncrementalSolverInterface_T solvers"));
        if(is_last_ts)
        {
            //For the last stage we only want 1 solution.
            bgips->SetNrDesiredSolutions(1);
        }
        else if(bgips->GetNrDesiredSolutions()!=INT_MAX)
            throw(E("GMAA_MAAstar requires a BGIP solver to return all solutions (when requested)"));

        // associate the resulting incremental BGIPSolver with this
        // PPI, so that we can reuse it
        //ppi->SetBGIPSolver_T_Pointer(bgips);
        ppi->SetBGIPSolverPointer( boost::static_pointer_cast<BayesianGameIdenticalPayoffSolver>(bgips) );
    }
    else // we already have the solver:
    {
        if(_m_verboseness >= 8) 
            cout << "GMAA_MAAstarCluster: ppi was expanded before, getting the previous BGIPSolver..." << endl;

        //bgipsNonIncremental=ppi->GetBGIPSolver_T_PointerCluster();
        bgipsNonIncremental = ppi->GetBGIPSolverPointer();
        bgips = boost::dynamic_pointer_cast<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG> >(bgipsNonIncremental);
        if(bgips == 0)
            throw(E("GMAA_MAAstarCluster requires BGIP_IncrementalSolverInterface_T solvers"));
        bg_ts = boost::dynamic_pointer_cast<const BayesianGameWithClusterInfo>(bgips->GetBGIPI());
        if(bg_ts == 0)
            throw(E("GMAA_MAAstarCluster BG is not of the correct type"));
    }

    if(_m_verboseness >= 2) {
        cout << "About to solve the following BG:"<< endl;
        cout << bg_ts->SoftPrint() << endl;
    }

    double pastReward_prevTs = pP->GetPastReward();

    stringstream ss;
    ss << "GMAA_MAAstarCluster::NextExact_ts" << setw(3) << setfill('0') << ts;
    StartTimer(ss.str());
    
    // Compute bounds on the value solving this CBG can result in
    SetCBGbounds(ppi,bgipsNonIncremental);

    // a copy, which is only used for the last stage
    JointPolicyPureVectorForClusteredBG bestLBjpolBG = 
        JointPolicyPureVectorForClusteredBG(bg_ts);

    // Ask the BGIPSolver for the next solution, which might not exist
    // due to the bounds on the value of the solution
    double val;
    boost::shared_ptr<JointPolicyDiscretePure> bgpol_jpdp;
    /// Calling the BGIPSolver
    bool foundCBGsolution = bgips->GetNextJointPolicyAndValue(bgpol_jpdp, val);

    if(foundCBGsolution)
    {
        JPPVfCBG_sharedPtr bgpol = boost::dynamic_pointer_cast<JointPolicyPureVectorForClusteredBG>(bgpol_jpdp);
        if(bgpol==0)
            throw(E("GMAA_MAAstarCluster: did not get a valid policy from the incremental BGIP solver"));
        double immR = bg_ts->ComputeDiscountedImmediateRewardForJPol(bgpol);
        
        JPPVfCBG_sharedPtr jpolBGcopy = boost::make_shared<JointPolicyPureVectorForClusteredBG>(*boost::dynamic_pointer_cast<JointPolicyPureVectorForClusteredBG>(bgpol));
        jpolBGcopy->SetDepth(ts+1);

        double discountToThePowerT = pow( GetDiscount(), (double)(ts) );
        double discounted_F = discountToThePowerT * val;

        //compute expected immediate reward for this stage
        double newPastreward = pastReward_prevTs + immR;
        jpolBGcopy->SetPastReward(newPastreward);
        
        //push this policy and value on the priority queue
        ////if last stage, if so, we want to return the 
        ////*EXACT* past reward, newPastreward.
        double newValue;
        if(is_last_ts)
            newValue=newPastreward;
        else
            newValue=pastReward_prevTs + discounted_F;

        poolOfNextPolicies->Insert( NewPPI(jpolBGcopy,newValue) );

        if(ts>0)
        {
            double oldValue=ppi->GetValue();
            // now we update the current PPI with the value of the next sibling
            // other option is the value of this child
//        ppi->SetValue(bgips->GetPayoff());
            ppi->SetValue(newValue);//-(1e-10));

            if(GetDiscount()==1.0 &&
               oldValue < ppi->GetValue() &&
               !EqualReward(oldValue, ppi->GetValue()))
            {
                stringstream ss;
                ss << "GMAA_MAAstarCluster value of parent can only go down when being updated: old value="
                   << oldValue << " new value=" << ppi->GetValue()
                   << " old-new=" << oldValue-ppi->GetValue();
                throw(E(ss));
            }
        }
    }
    else // we did NOT get a valid solution from this CBG
    {
        if(_m_verboseness >= 1)
            cout << "GMAA_MAAstar no valid solution returned by the Incremental BGIP Solver"<< endl;

        // as we didn't any solution for the CBG, we know this branch
        // of the tree can never contain the optimal policy, so we set
        // its value very low
        ppi->SetValue(-DBL_MAX);
    }

    // if we returned all solutions from this BG, it has to be deleted
    // from the policy pool
    if(bgips->AllSolutionsHaveBeenReturned())
    {
        if(_m_verboseness >= 4)
            cout << ">>>AllSolutionsHaveBeenReturned, removing " << pP->SoftPrint()
                 << "<<<"<<endl;
        cleanUpPPI=true;
    }
    else
        cleanUpPPI=false;

    StopTimer(ss.str());
    //if we created a BG for the last time step t=h-1 - we have a lowerbound
    return(is_last_ts);
}